

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void do_com_sub_exp(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  vreg_info *pvVar1;
  int vreg;
  int iVar2;
  virtual_insn *insn;
  char *pcVar3;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  dill_stream in_RDI;
  virtual_insn *sub_ip;
  virtual_insn *previous_ip;
  int use_target;
  int insn_is_store;
  int stop2;
  int l;
  int replace_vreg;
  virtual_insn *ip;
  int root_is_load;
  int used_vregs [3];
  int stop;
  int k;
  int do_ldi0_optim;
  int def_vreg;
  virtual_insn *root_insn;
  void *in_stack_00000228;
  void *in_stack_00000230;
  dill_stream in_stack_00000238;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  byte bVar4;
  undefined1 uVar5;
  bool bVar6;
  virtual_insn *in_stack_ffffffffffffff88;
  int local_64;
  int local_5c;
  uint local_58;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  virtual_insn *local_28;
  uint local_1c;
  long local_18;
  long local_10;
  dill_stream local_8;
  
  local_28 = (virtual_insn *)(in_RDX + (long)(int)in_ECX * 0x28);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2c = insn_defines(in_stack_ffffffffffffff88);
  local_30 = 0;
  local_38 = 0;
  if ((local_2c != 0xffffffff) && (insn_uses(local_28,(int *)&local_44), local_44 != 0xffffffff)) {
    if ((local_28->class_code == '\0') && (local_28->insn_code == '(')) {
      local_30 = 1;
    }
    if ((local_2c == 0xffffffff) ||
       (((local_44 != local_2c && (local_40 != local_2c)) && (local_3c != local_2c)))) {
      if (local_8->dill_debug != 0) {
        printf("Try to replace %d ",(ulong)local_1c);
        virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
        printf("\n");
      }
      local_34 = local_1c;
      if ((local_28->class_code == '\x06') ||
         (uVar5 = false, bVar6 = (bool)uVar5, local_28->class_code == '\x05')) {
        uVar5 = (local_28->insn_code & 0x10U) != 0x10;
        bVar6 = (bool)uVar5;
      }
LAB_0011e294:
      local_34 = local_34 + 1;
      bVar4 = 0;
      if ((long)(int)local_34 <= *(long *)(local_10 + 8)) {
        bVar4 = local_38 != 0 ^ 0xff;
      }
      if ((bVar4 & 1) != 0) {
        insn = (virtual_insn *)(local_18 + (long)(int)local_34 * 0x28);
        vreg = insn_defines(in_stack_ffffffffffffff88);
        iVar2 = insn_define_test(in_stack_ffffffffffffff88,
                                 CONCAT13(uVar5,CONCAT12(bVar4,CONCAT11(in_stack_ffffffffffffff85,
                                                                        in_stack_ffffffffffffff84)))
                                );
        if (iVar2 != 0) {
          local_38 = local_38 + 1;
        }
        iVar2 = insn_define_test(in_stack_ffffffffffffff88,
                                 CONCAT13(uVar5,CONCAT12(bVar4,CONCAT11(in_stack_ffffffffffffff85,
                                                                        in_stack_ffffffffffffff84)))
                                );
        if (iVar2 != 0) {
          local_38 = local_38 + 1;
        }
        if ((local_40 != 0xffffffff) &&
           (iVar2 = insn_define_test(in_stack_ffffffffffffff88,
                                     CONCAT13(uVar5,CONCAT12(bVar4,CONCAT11(
                                                  in_stack_ffffffffffffff85,
                                                  in_stack_ffffffffffffff84)))), iVar2 != 0)) {
          local_38 = local_38 + 1;
        }
        if ((local_3c != 0xffffffff) &&
           (iVar2 = insn_define_test(in_stack_ffffffffffffff88,
                                     CONCAT13(uVar5,CONCAT12(bVar4,CONCAT11(
                                                  in_stack_ffffffffffffff85,
                                                  in_stack_ffffffffffffff84)))), iVar2 != 0)) {
          local_38 = local_38 + 1;
        }
        if ((insn->class_code == '\x06') ||
           (in_stack_ffffffffffffff85 = false, insn->class_code == '\x05')) {
          in_stack_ffffffffffffff85 = (insn->insn_code & 0x10U) == 0x10;
        }
        if ((bVar6 != false) && ((bool)in_stack_ffffffffffffff85 != false)) {
          local_38 = local_38 + 1;
        }
        if ((((local_30 != 0) && (insn->class_code == '\x06')) &&
            ((insn->opnds).a3.src1 == local_2c)) && ((insn->opnds).bri.imm_a == (void *)0x0))
        goto code_r0x0011e409;
        goto LAB_0011e600;
      }
      if (local_8->dill_debug != 0) {
        printf("stopped \n");
      }
    }
  }
  return;
code_r0x0011e409:
  local_64 = 1;
  if (local_2c == local_44) {
    local_64 = 2;
  }
  if (local_2c == local_40) {
    local_64 = local_64 + 1;
  }
  if ((local_64 == 0) || (local_8->p->vregs[(int)(local_2c - 100)].use_info.use_count == local_64))
  {
    if (local_8->dill_debug != 0) {
      printf("load opt, changing  - ");
      virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
      printf(" - to - ");
    }
    insn->class_code = '\x05';
    (insn->opnds).a3.dest = (insn->opnds).a3.dest;
    (insn->opnds).a3.src1 = local_44;
    (insn->opnds).a3.src2 = local_40;
    if (local_8->dill_debug != 0) {
      virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
      printf("\n");
    }
    if (99 < (int)local_2c) {
      pvVar1 = local_8->p->vregs;
      pvVar1[(int)(local_2c - 100)].use_info.use_count =
           pvVar1[(int)(local_2c - 100)].use_info.use_count + -1;
    }
    if ((int)local_8->p->vregs[(int)(local_2c - 100)].use_info.use_count == local_64 + -1) {
      pvVar1 = local_8->p->vregs;
      pvVar1[(int)(local_2c - 100)].use_info.def_count =
           pvVar1[(int)(local_2c - 100)].use_info.def_count + -1;
      if (local_8->dill_debug != 0) {
        printf("load opt eliminating  - ");
        virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
        printf("\n");
      }
      local_28->class_code = '\x18';
    }
    else {
LAB_0011e600:
      if (vreg != -1) {
        iVar2 = insn_use_test(insn,local_2c);
        if (iVar2 != 0) {
          local_30 = 0;
        }
        iVar2 = insn_same_except_dest(insn,local_28);
        if ((iVar2 != 0) &&
           (iVar2 = live_at_end((basic_block_conflict)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0),
           iVar2 == 0)) {
          if (local_8->dill_debug != 0) {
            printf("eliminating  - - %d - ",(ulong)local_34);
            virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
            printf("\n");
          }
          if ((((insn->class_code == '\x05') && ((int)(local_1c + 1) < (int)local_34)) &&
              (pcVar3 = (char *)(local_18 + (long)(int)(local_34 - 1) * 0x28), *pcVar3 == '\x0e'))
             && (*(int *)(pcVar3 + 8) == 1)) {
            *pcVar3 = '\x18';
          }
          insn->class_code = '\x18';
          local_5c = 0;
          local_58 = local_34;
          while( true ) {
            local_58 = local_58 + 1;
            in_stack_ffffffffffffff84 = 0;
            if ((long)(int)local_58 <= *(long *)(local_10 + 8)) {
              in_stack_ffffffffffffff84 = local_5c != 0 ^ 0xff;
            }
            if ((in_stack_ffffffffffffff84 & 1) == 0) break;
            in_stack_ffffffffffffff88 = (virtual_insn *)(local_18 + (long)(int)local_58 * 0x28);
            iVar2 = insn_define_test(in_stack_ffffffffffffff88,
                                     CONCAT13(uVar5,CONCAT12(bVar4,CONCAT11(
                                                  in_stack_ffffffffffffff85,
                                                  in_stack_ffffffffffffff84))));
            if (iVar2 != 0) {
              local_5c = local_5c + 1;
            }
            iVar2 = insn_use_test(in_stack_ffffffffffffff88,vreg);
            if (iVar2 != 0) {
              if (local_8->dill_debug != 0) {
                printf("   Reg %d forward subst - Replacing %d ",(ulong)local_2c,(ulong)local_58);
                virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
                printf(" with ");
              }
              replace_insn_src((virtual_insn *)
                               CONCAT17(uVar5,CONCAT16(bVar4,CONCAT15(in_stack_ffffffffffffff85,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
              set_used(local_8,local_2c);
              if (local_8->dill_debug != 0) {
                virtual_print_insn(in_stack_00000238,in_stack_00000230,in_stack_00000228);
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0011e294;
}

Assistant:

static void
do_com_sub_exp(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* root_insn = &((virtual_insn*)insns)[loc];
    int def_vreg = insn_defines(root_insn);
    int do_ldi0_optim = 0;
    int k;
    int stop = 0;
    int used_vregs[3];
    int root_is_load;
    if (def_vreg == -1)
        return;
    insn_uses(root_insn, &used_vregs[0]);
    if (used_vregs[0] == -1)
        return;
    if ((root_insn->class_code == iclass_arith3) &&
        (root_insn->insn_code == dill_jmp_addp))
        do_ldi0_optim = 1;

    if (def_vreg != -1) {
        if ((used_vregs[0] == def_vreg) || (used_vregs[1] == def_vreg) ||
            (used_vregs[2] == def_vreg))
            return;
    }

    /*
     * see if we can find an instruction just like (
     * except for dest) this ahead
     */
    if (c->dill_debug) {
        printf("Try to replace %d ", loc);
        virtual_print_insn(c, NULL, root_insn);
        printf("\n");
    }
    root_is_load = (((root_insn->class_code == iclass_loadstorei) ||
                     (root_insn->class_code == iclass_loadstore)) &&
                    (((root_insn->insn_code & 0x10) == 0x10) == 0));
    for (k = loc + 1; ((k <= bb->end) && (!stop)); k++) {
        virtual_insn* ip = &((virtual_insn*)insns)[k];
        int replace_vreg = insn_defines(ip);
        int l, stop2, insn_is_store;
        /* stop looking if old dest is wiped */
        if (insn_define_test(ip, def_vreg))
            stop++;
        /* stop looking if srcs become different */
        if (insn_define_test(ip, used_vregs[0]))
            stop++;
        if ((used_vregs[1] != -1) && insn_define_test(ip, used_vregs[1]))
            stop++;
        if ((used_vregs[2] != -1) && insn_define_test(ip, used_vregs[2]))
            stop++;
        /* stop looking if this is a load and we're about to pass a store */
        insn_is_store = (((ip->class_code == iclass_loadstorei) ||
                          (ip->class_code == iclass_loadstore)) &&
                         ((ip->insn_code & 0x10) == 0x10));
        if (root_is_load && insn_is_store)
            stop++;

        if (do_ldi0_optim && (ip->class_code == iclass_loadstorei) &&
            (ip->opnds.a3i.src == def_vreg) && (ip->opnds.a3i.u.imm == 0)) {
            int use_target = 1;
            /*
             * we've found a load immediate with an imm of 0 and with
             * a source that is the result of a prior add
             * combine them.
             */
            if (def_vreg == used_vregs[0])
                use_target++;
            if (def_vreg == used_vregs[1])
                use_target++;
            if ((use_target != 0) &&
                (c->p->vregs[def_vreg - 100].use_info.use_count !=
                 use_target)) {
                continue;
            }
            if (c->dill_debug) {
                printf("load opt, changing  - ");
                virtual_print_insn(c, NULL, ip);
                printf(" - to - ");
            }
            ip->class_code = iclass_loadstore;
            ip->opnds.a3.dest = ip->opnds.a3i.dest;
            ip->opnds.a3.src1 = used_vregs[0];
            ip->opnds.a3.src2 = used_vregs[1];
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, ip);
                printf("\n");
            }
            if (def_vreg >= 100) {
                c->p->vregs[def_vreg - 100].use_info.use_count--;
            }
            if (c->p->vregs[def_vreg - 100].use_info.use_count ==
                (use_target - 1)) {
                c->p->vregs[def_vreg - 100].use_info.def_count--;
                if (c->dill_debug) {
                    printf("load opt eliminating  - ");
                    virtual_print_insn(c, NULL, root_insn);
                    printf("\n");
                }
                root_insn->class_code = iclass_nop;
                continue;
            }
        }

        if (replace_vreg == -1)
            continue;
        if (insn_use_test(ip, def_vreg))
            do_ldi0_optim = 0;

        /*
         * insn is the same except for dest, make it a noop
         * and fixup uses of replace_vreg going forward
         */
        if (!insn_same_except_dest(ip, root_insn))
            continue;
        if (live_at_end(bb, replace_vreg))
            continue;
        if (c->dill_debug) {
            printf("eliminating  - - %d - ", k);
            virtual_print_insn(c, NULL, ip);
            printf("\n");
        }

        if (ip->class_code == iclass_loadstore) {
            if (k > loc + 1) {
                virtual_insn* previous_ip = &((virtual_insn*)insns)[k - 1];
                if ((previous_ip->class_code == iclass_special) &&
                    (previous_ip->opnds.spec.type == DILL_SEGMENTED_FOLLOWS)) {
                    /*
                     * We're eliminating a loadstore and previous was a
                     * special SEGMENTED_FOLLOWS, kill the special too.
                     */
                    previous_ip->class_code = iclass_nop;
                }
            }
        }

        ip->class_code = iclass_nop;
        stop2 = 0;
        for (l = k + 1; ((l <= bb->end) && (!stop2)); l++) {
            virtual_insn* sub_ip = &((virtual_insn*)insns)[l];
            if (insn_define_test(sub_ip, replace_vreg)) {
                stop2++;
            }
            if (!insn_use_test(sub_ip, replace_vreg))
                continue;
            if (c->dill_debug) {
                printf("   Reg %d forward subst - Replacing %d ", def_vreg, l);
                virtual_print_insn(c, NULL, sub_ip);
                printf(" with ");
            }
            replace_insn_src(sub_ip, replace_vreg, def_vreg);
            set_used(c, def_vreg);
            if (c->dill_debug) {
                virtual_print_insn(c, NULL, sub_ip);
                printf("\n");
            }
        }
    }
    if (c->dill_debug) {
        printf("stopped \n");
    }
}